

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

int ImfTiledOutputWriteTile(ImfTiledOutputFile *out,int dx,int dy,int lx,int ly)

{
  Imf_3_4::TiledRgbaOutputFile::writeTile((TiledRgbaOutputFile *)out,dx,dy,lx,ly);
  return 1;
}

Assistant:

int
ImfTiledOutputWriteTile (
    ImfTiledOutputFile* out, int dx, int dy, int lx, int ly)
{
    try
    {
        outfile (out)->writeTile (dx, dy, lx, ly);
        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}